

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::EntryValues(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x48c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b91e03;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x48f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b91e03:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((local_30._0_4_ & 0xfffffe) == 0) {
    pRVar5 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar5 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_30,1);
  }
  pRVar5 = JavascriptOperators::ToObject(pRVar5,pSVar1);
  pvVar6 = GetValuesOrEntries(pRVar5,true,pSVar1);
  return pvVar6;
}

Assistant:

Var JavascriptObject::EntryValues(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));
    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_values);

    Var tempVar = args.Info.Count < 2 ? scriptContext->GetLibrary()->GetUndefined() : args[1];
    RecyclableObject *object = JavascriptOperators::ToObject(tempVar, scriptContext);

    return GetValuesOrEntries(object, true /*valuesToReturn*/, scriptContext);
}